

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

string * __thiscall
google::protobuf::descriptor_unittest::EmbedAggregateValue_abi_cxx11_
          (string *__return_storage_ptr__,descriptor_unittest *this,char *value)

{
  Arg *in_R8;
  string_view format;
  string_view local_38 [3];
  
  local_38[0] = absl::lts_20250127::NullSafeStringView((Nullable<const_char_*>)this);
  format._M_str = (char *)local_38;
  format._M_len =
       (size_t)
       "name: \"foo.proto\" dependency: \"google/protobuf/descriptor.proto\" message_type { name: \"Foo\" } extension { name: \"foo\" number: 7672757 label: LABEL_OPTIONAL             type: TYPE_MESSAGE type_name: \"Foo\"             extendee: \"google.protobuf.FileOptions\" }options { uninterpreted_option { name { name_part: \"foo\"                                         is_extension: true }                                  $0 } }"
  ;
  absl::lts_20250127::Substitute_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)0x19e,format,in_R8);
  return __return_storage_ptr__;
}

Assistant:

static std::string EmbedAggregateValue(const char* value) {
  return absl::Substitute(
      "name: \"foo.proto\" "
      "dependency: \"google/protobuf/descriptor.proto\" "
      "message_type { name: \"Foo\" } "
      "extension { name: \"foo\" number: 7672757 label: LABEL_OPTIONAL "
      "            type: TYPE_MESSAGE type_name: \"Foo\" "
      "            extendee: \"google.protobuf.FileOptions\" }"
      "options { uninterpreted_option { name { name_part: \"foo\" "
      "                                        is_extension: true } "
      "                                 $0 } }",
      value);
}